

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_build_parser.cpp
# Opt level: O2

void Omega_h::print_set(set<int,_std::less<int>,_std::allocator<int>_> *set,Grammar *grammar)

{
  bool bVar1;
  const_reference __lhs;
  _Base_ptr p_Var2;
  char *pcVar3;
  
  std::operator<<((ostream *)&std::cerr,"{");
  p_Var2 = (set->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    if ((_Rb_tree_header *)p_Var2 == &(set->_M_t)._M_impl.super__Rb_tree_header) {
      std::operator<<((ostream *)&std::cerr,"}");
      return;
    }
    if (p_Var2 != (set->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left) {
      std::operator<<((ostream *)&std::cerr,", ");
    }
    if (p_Var2[1]._M_color == 0xfffffe57) {
      pcVar3 = "null";
LAB_00246d69:
      std::operator<<((ostream *)&std::cerr,pcVar3);
    }
    else {
      __lhs = at<std::__cxx11::string>(&grammar->symbol_names,p_Var2[1]._M_color);
      bVar1 = std::operator==(__lhs,",");
      if (bVar1) {
        pcVar3 = "\',\'";
        goto LAB_00246d69;
      }
      std::operator<<((ostream *)&std::cerr,(string *)__lhs);
    }
    p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
  } while( true );
}

Assistant:

static void print_set(std::set<int> const& set, Grammar const& grammar) {
  std::cerr << "{";
  for (auto it = set.begin(); it != set.end(); ++it) {
    if (it != set.begin()) std::cerr << ", ";
    auto symb = *it;
    if (symb == FIRST_NULL)
      std::cerr << "null";
    else {
      auto& symb_name = at(grammar.symbol_names, symb);
      if (symb_name == ",")
        std::cerr << "','";
      else
        std::cerr << symb_name;
    }
  }
  std::cerr << "}";
}